

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O2

void text_sequence_tick(t_text_sequence *x)

{
  uchar uVar1;
  
  x->x_lastto = (t_symbol *)0x0;
  do {
    if (x->x_auto == '\0') {
      return;
    }
    x->x_loop = '\x01';
    uVar1 = '\x01';
    while (uVar1 != '\0') {
      text_sequence_doit(x,x->x_argc,x->x_argv);
      uVar1 = x->x_loop;
    }
  } while (x->x_nextdelay <= 0.0);
  if (x->x_auto == '\0') {
    return;
  }
  clock_delay(x->x_clock,(double)x->x_nextdelay);
  return;
}

Assistant:

static void text_sequence_tick(t_text_sequence *x)  /* clock callback */
{
    x->x_lastto = 0;
    while (x->x_auto)
    {
        x->x_loop = 1;
        while (x->x_loop)
            text_sequence_doit(x, x->x_argc, x->x_argv);
        if (x->x_nextdelay > 0)
            break;
    }
    if (x->x_auto)
        clock_delay(x->x_clock, x->x_nextdelay);
}